

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

LabelInstr * __thiscall
Lowerer::LowerGeneratorHelper::InsertBailOutForElidedYield(LowerGeneratorHelper *this)

{
  YieldOffsetResumeLabelList *pYVar1;
  Instr *this_00;
  RegNum reg;
  LabelInstr **ppLVar2;
  LabelInstr *instr;
  Instr *instr_00;
  BranchInstr *instr_01;
  RegOpnd *opndArg;
  long lVar3;
  long lVar4;
  
  pYVar1 = this->func->m_yieldOffsetResumeLabelList;
  if ((pYVar1->
      super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
      ).count < 1) {
    instr = (LabelInstr *)0x0;
  }
  else {
    ppLVar2 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second
                        ((pYVar1->
                         super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                         ).buffer);
    if (*ppLVar2 != (LabelInstr *)0x0) {
      instr = (LabelInstr *)0x0;
      lVar4 = 0;
      lVar3 = 0x18;
      do {
        lVar4 = lVar4 + 1;
        if ((pYVar1->
            super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
            ).count <= lVar4) goto LAB_005f36f1;
        ppLVar2 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second
                            ((Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
                             ((long)&((pYVar1->
                                      super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                                      ).buffer)->first + lVar3));
        lVar3 = lVar3 + 0x18;
      } while (*ppLVar2 != (LabelInstr *)0x0);
    }
    instr = IR::LabelInstr::New(Label,this->func,false);
  }
LAB_005f36f1:
  if (instr != (LabelInstr *)0x0) {
    instr->field_0x78 = instr->field_0x78 | 4;
    this_00 = this->func->m_bailOutForElidedYieldInsertionPoint->m_next;
    instr_00 = IR::Instr::New(Call,this->func);
    EnsureEpilogueLabels(this);
    instr_01 = IR::BranchInstr::New(JMP,this->epilogueForBailOut,this->func);
    IR::Instr::InsertBefore(this_00,&instr->super_Instr);
    IR::Instr::InsertBefore(this_00,instr_00);
    IR::Instr::InsertBefore(this_00,&instr_01->super_Instr);
    reg = LowererMDArch::GetRegFramePointer();
    opndArg = IR::RegOpnd::New((StackSym *)0x0,reg,TyUint64,this->func);
    LowererMD::LoadHelperArgument(this->lowererMD,instr_00,&opndArg->super_Opnd);
    LowererMD::ChangeToHelperCall
              (this->lowererMD,instr_00,HelperNoSaveRegistersBailOutForElidedYield,(LabelInstr *)0x0
               ,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    instr->m_name = L"GeneratorBailOutForElidedYield";
  }
  return instr;
}

Assistant:

IR::LabelInstr*
Lowerer::LowerGeneratorHelper::InsertBailOutForElidedYield()
{
    IR::LabelInstr* bailOutNoSaveLabel = nullptr;

    this->func->MapUntilYieldOffsetResumeLabels([this, &bailOutNoSaveLabel](int, const YieldOffsetResumeLabel& yorl)
    {
        if (yorl.Second() == nullptr)
        {
            if (bailOutNoSaveLabel == nullptr)
            {
                bailOutNoSaveLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
            }

            return true;
        }

        return false;
    });

    // Insert the bailoutnosave label somewhere along with a call to BailOutNoSave helper
    if (bailOutNoSaveLabel != nullptr)
    {
        bailOutNoSaveLabel->m_hasNonBranchRef = true;

        IR::Instr* insertionPoint = this->func->m_bailOutForElidedYieldInsertionPoint->m_next;
        IR::Instr* bailOutCall = IR::Instr::New(Js::OpCode::Call, this->func);
        IR::Instr* branchToEpilogue = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, this->GetEpilogueForBailOut(), this->func);

        insertionPoint->InsertBefore(bailOutNoSaveLabel);
        insertionPoint->InsertBefore(bailOutCall);
        insertionPoint->InsertBefore(branchToEpilogue);

        IR::RegOpnd* frameRegOpnd = IR::RegOpnd::New(nullptr, LowererMD::GetRegFramePointer(), TyMachPtr, this->func);
        this->lowererMD.LoadHelperArgument(bailOutCall, frameRegOpnd);
        this->lowererMD.ChangeToHelperCall(bailOutCall, IR::HelperNoSaveRegistersBailOutForElidedYield);

        LABELNAMESET(bailOutNoSaveLabel, "GeneratorBailOutForElidedYield");
    }

    return bailOutNoSaveLabel;
}